

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.h
# Opt level: O0

int CG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,TPZFMatrix<float> *residual,int64_t *max_iter,double *tol,
              int FromCurrent)

{
  ostream *poVar1;
  void *this;
  long *in_RCX;
  undefined8 in_RDX;
  TPZFMatrix<float> *in_RSI;
  long *in_RDI;
  TPZFMatrix<float> *in_R8;
  long *in_R9;
  float fVar2;
  REAL RVar3;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  TPZFMatrix<float> *r;
  TPZFMatrix<float> *res;
  TPZFMatrix<float> resbackup;
  REAL normb;
  REAL rho_1;
  REAL rho;
  REAL beta;
  REAL alpha;
  TPZFMatrix<float> q;
  TPZFMatrix<float> z;
  TPZFMatrix<float> p;
  double resid;
  TPZFMatrix<float> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  TPZFMatrix<float> *in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  long local_2d8;
  TPZFMatrix<float> *local_2c0;
  TPZFMatrix<float> local_2b8;
  double local_228;
  TPZFMatrix<float> *local_220;
  TPZFMatrix<float> *local_218;
  double local_210;
  double local_208;
  TPZFMatrix<float> local_200;
  TPZFMatrix<float> local_160;
  TPZFMatrix<float> local_d0;
  double local_40;
  long *local_38;
  TPZFMatrix<float> *local_30;
  long *local_28;
  undefined8 local_20;
  TPZFMatrix<float> *local_18;
  long *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  local_220 = (TPZFMatrix<float> *)0x0;
  fVar2 = Norm((TPZFMatrix<float> *)0x12fccca);
  local_228 = TPZExtractVal::val(fVar2);
  TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)CONCAT44(fVar2,in_stack_fffffffffffffd20));
  local_2c0 = local_30;
  if (local_30 == (TPZFMatrix<float> *)0x0) {
    local_2c0 = &local_2b8;
  }
  if (in_stack_00000010 == 0) {
    (*(local_18->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<float>::operator=
              ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               in_stack_fffffffffffffd00);
  }
  else {
    (**(code **)(*local_10 + 0x138))(local_10,local_18,local_20,local_2c0,0);
  }
  if ((local_228 == 0.0) && (!NAN(local_228))) {
    local_228 = 1.0;
  }
  fVar2 = Norm((TPZFMatrix<float> *)0x12fce2d);
  RVar3 = TPZExtractVal::val(fVar2);
  local_40 = RVar3 / local_228;
  if (*in_stack_00000008 < local_40) {
    for (local_2d8 = 1; local_2d8 <= *local_38; local_2d8 = local_2d8 + 1) {
      (**(code **)(*local_28 + 0x58))(local_28,local_2c0,&local_160,0);
      in_stack_fffffffffffffd1c =
           Dot<float>((TPZFMatrix<float> *)
                      CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                      in_stack_fffffffffffffd10);
      local_218 = (TPZFMatrix<float> *)TPZExtractVal::val(in_stack_fffffffffffffd1c);
      if (local_2d8 == 1) {
        TPZFMatrix<float>::operator=
                  ((TPZFMatrix<float> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   in_stack_fffffffffffffd00);
      }
      else {
        local_210 = (double)local_218 / (double)local_220;
        TPZFMatrix<float>::TimesBetaPlusZ(&local_d0,(float)local_210,&local_160);
      }
      (**(code **)(*local_10 + 0x128))(local_10,&local_d0,&local_200,0);
      in_stack_fffffffffffffd10 = local_218;
      in_stack_fffffffffffffd18 =
           Dot<float>((TPZFMatrix<float> *)
                      CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),local_218);
      RVar3 = TPZExtractVal::val(in_stack_fffffffffffffd18);
      local_208 = (double)in_stack_fffffffffffffd10 / RVar3;
      TPZFMatrix<float>::ZAXPY(local_18,(float)local_208,&local_d0);
      TPZFMatrix<float>::ZAXPY(local_2c0,(float)-local_208,&local_200);
      in_stack_fffffffffffffd0c = Norm((TPZFMatrix<float> *)0x12fd047);
      RVar3 = TPZExtractVal::val(in_stack_fffffffffffffd0c);
      local_40 = RVar3 / local_228;
      if (local_40 <= *in_stack_00000008) {
        *in_stack_00000008 = local_40;
        *local_38 = local_2d8;
        local_4 = 0;
        goto LAB_012fd17e;
      }
      local_220 = local_218;
    }
    *in_stack_00000008 = local_40;
    poVar1 = std::operator<<((ostream *)&std::cout,"cg iter = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2d8);
    poVar1 = std::operator<<(poVar1," res = ");
    this = (void *)std::ostream::operator<<(poVar1,local_40);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    *in_stack_00000008 = local_40;
    *local_38 = 0;
    local_4 = 0;
  }
LAB_012fd17e:
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd188);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd195);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd1a2);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd1af);
  return local_4;
}

Assistant:

int
CG( Matrix &A, Vector &x, const Vector &b,
   Preconditioner &M, Vector *residual, int64_t &max_iter, Real &tol,const int FromCurrent)
{
	Real resid;
	Vector p, z, q;
	REAL alpha, beta, rho, rho_1 = 0;
	
    REAL normb = TPZExtractVal::val(Norm(b));
	Vector resbackup;
	Vector *res = residual;
	
#ifdef TEST
	std::list< TPZFMatrix<REAL> > plist,qlist;
	std::list< TPZFMatrix<REAL> >::iterator jt;
	std::list< TPZFMatrix<REAL> >::iterator kt;
	Vector Au;
#endif
	
	if(!res) res = &resbackup;
	Vector &r = *res;
	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    }
	else {
		x.Zero();
		r = b;
	}
	
	if (normb == 0.0)
		normb = 1.0;
	
    if ((resid = (TPZExtractVal::val( Norm(r) ) ) / normb) <= tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	int64_t i;
	for (i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
        rho = TPZExtractVal::val(Dot(r, z));
		
		if (i == 1)
			p = z;
		else {
			beta = rho / rho_1;
			p.TimesBetaPlusZ(beta,z);
		}
#ifdef TEST
		
		plist.push_back(p);
#endif	 
		
		A.Multiply(p,q);
		alpha = rho / (TPZExtractVal::val(Dot(p, q)));
		
#ifdef TEST
		qlist.push_back(q);
#endif
		
		x.ZAXPY(alpha,p);
		r.ZAXPY(-alpha,q);
		
#ifdef TEST
		A.Multiply(x,Au);
		REAL energy = Dot(x,Au)/2.-Dot(x,b);
#endif
		
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) <= tol) {
			tol = resid;
			max_iter = i;
#ifdef PZDEBUG
			std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
#endif
			return 0;
		}
#ifdef PZDEBUG
		std::cout << "cg iter = " << i <<  " res = " << resid /*<< " energy " << energy */ << std::endl;
#endif
#ifdef TEST
		std::cout << " energy " << energy << std::endl;
		TPZFMatrix<REAL> inner(plist.size(),plist.size(),0.);
		{
			int64_t j,k;
			for(j=0, jt = plist.begin(); jt != plist.end(); jt++,j++)
			{
				for(k=0, kt = qlist.begin(); kt != qlist.end(); kt++,k++)
				{
					inner(j,k) = Dot((*jt),(*kt));
				}
			}
		}
		inner.Print("Inner product of search directions");
#endif
		rho_1 = rho;
	}
	
	tol = resid;
	std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
	return 1;
}